

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

char * __thiscall btCollisionWorldImporter::duplicateName(btCollisionWorldImporter *this,char *name)

{
  int iVar1;
  char **ptr;
  int iVar2;
  size_t sVar3;
  char *__dest;
  char **ppcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  if (name == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(name);
    iVar2 = (int)sVar3;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (long)(iVar2 + 1)) {
      uVar8 = (long)(iVar2 + 1);
    }
    __dest = (char *)operator_new__(uVar8);
    memcpy(__dest,name,(long)iVar2);
    __dest[iVar2] = '\0';
    iVar2 = (this->m_allocatedNames).m_size;
    iVar1 = (this->m_allocatedNames).m_capacity;
    if (iVar2 == iVar1) {
      iVar7 = 1;
      if (iVar2 != 0) {
        iVar7 = iVar2 * 2;
      }
      if (iVar1 < iVar7) {
        if (iVar7 == 0) {
          ppcVar4 = (char **)0x0;
        }
        else {
          ppcVar4 = (char **)btAlignedAllocInternal((long)iVar7 << 3,0x10);
        }
        lVar5 = (long)(this->m_allocatedNames).m_size;
        if (0 < lVar5) {
          lVar6 = 0;
          do {
            ppcVar4[lVar6] = (this->m_allocatedNames).m_data[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar5 != lVar6);
        }
        ptr = (this->m_allocatedNames).m_data;
        if (ptr != (char **)0x0) {
          if ((this->m_allocatedNames).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
          }
          (this->m_allocatedNames).m_data = (char **)0x0;
        }
        (this->m_allocatedNames).m_ownsMemory = true;
        (this->m_allocatedNames).m_data = ppcVar4;
        (this->m_allocatedNames).m_capacity = iVar7;
      }
    }
    iVar2 = (this->m_allocatedNames).m_size;
    (this->m_allocatedNames).m_data[iVar2] = __dest;
    (this->m_allocatedNames).m_size = iVar2 + 1;
  }
  return __dest;
}

Assistant:

char* btCollisionWorldImporter::duplicateName(const char* name)
{
	if (name)
	{
		int l = (int)strlen(name);
		char* newName = new char[l+1];
		memcpy(newName,name,l);
		newName[l] = 0;
		m_allocatedNames.push_back(newName);
		return newName;
	}
	return 0;
}